

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricTracerCreateExpPrologue
          (ZETHandleLifetimeValidation *this,zet_context_handle_t hContext,
          zet_device_handle_t hDevice,uint32_t metricGroupCount,
          zet_metric_group_handle_t *phMetricGroups,zet_metric_tracer_exp_desc_t *desc,
          ze_event_handle_t hNotificationEvent,zet_metric_tracer_exp_handle_t *phMetricTracer)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  ze_result_t zVar4;
  ulong uVar5;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hContext);
  zVar4 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if ((bVar2) &&
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hDevice), bVar2)) {
    bVar2 = metricGroupCount == 0 || phMetricGroups == (zet_metric_group_handle_t *)0x0;
    if (metricGroupCount != 0 && phMetricGroups != (zet_metric_group_handle_t *)0x0) {
      bVar3 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phMetricGroups);
      if (bVar3) {
        uVar5 = 1;
        do {
          bVar2 = metricGroupCount <= uVar5 || phMetricGroups == (zet_metric_group_handle_t *)0x0;
          if (bVar2) goto LAB_001a8036;
          bVar3 = HandleLifetimeValidation::isHandleValid
                            (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phMetricGroups[uVar5]);
          uVar5 = uVar5 + 1;
        } while (bVar3);
      }
      if (!bVar2) {
        return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
      }
    }
LAB_001a8036:
    if ((hNotificationEvent != (ze_event_handle_t)0x0) &&
       (bVar2 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hNotificationEvent), !bVar2
       )) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
    zVar4 = ZE_RESULT_SUCCESS;
  }
  return zVar4;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricTracerCreateExpPrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t* phMetricGroups,      ///< [in][range(0, metricGroupCount )] handles of the metric groups to
                                                        ///< trace
        zet_metric_tracer_exp_desc_t* desc,             ///< [in,out] metric tracer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification. Note:
                                                        ///< If buffer is not drained when the event it flagged, there is a risk of
                                                        ///< HW event buffer being overrun
        zet_metric_tracer_exp_handle_t* phMetricTracer  ///< [out] handle of the metric tracer
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phMetricGroups) && (i < metricGroupCount ); ++i){
            if (!context.handleLifetime->isHandleValid( phMetricGroups[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        if (hNotificationEvent && !context.handleLifetime->isHandleValid( hNotificationEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }